

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

SurfaceMesh * __thiscall polyscope::SurfaceMesh::setEdgeColor(SurfaceMesh *this,vec3 val)

{
  undefined1 auVar1 [16];
  undefined8 in_XMM0_Qb;
  vec<3,_float,_(glm::qualifier)0> local_18;
  
  local_18.field_2 = val.field_2;
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = val._0_8_;
  local_18._0_8_ = vmovlps_avx(auVar1);
  PersistentValue<glm::vec<3,float,(glm::qualifier)0>>::operator=
            ((PersistentValue<glm::vec<3,float,(glm::qualifier)0>> *)&this->edgeColor,&local_18);
  requestRedraw();
  return this;
}

Assistant:

SurfaceMesh* SurfaceMesh::setEdgeColor(glm::vec3 val) {
  edgeColor = val;
  requestRedraw();
  return this;
}